

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O0

secp256k1_scratch * secp256k1_scratch_create(secp256k1_callback *error_callback,size_t size)

{
  secp256k1_scratch *__s;
  size_t in_RSI;
  secp256k1_scratch *ret;
  void *alloc;
  size_t base_alloc;
  size_t in_stack_ffffffffffffffd8;
  secp256k1_callback *in_stack_ffffffffffffffe0;
  secp256k1_scratch *psVar1;
  
  __s = (secp256k1_scratch *)checked_malloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (__s != (secp256k1_scratch *)0x0) {
    psVar1 = __s;
    memset(__s,0,0x20);
    builtin_memcpy(__s->magic,"scratch",8);
    __s->data = psVar1 + 1;
    __s->max_size = in_RSI;
  }
  return __s;
}

Assistant:

static secp256k1_scratch* secp256k1_scratch_create(const secp256k1_callback* error_callback, size_t size) {
    const size_t base_alloc = ROUND_TO_ALIGN(sizeof(secp256k1_scratch));
    void *alloc = checked_malloc(error_callback, base_alloc + size);
    secp256k1_scratch* ret = (secp256k1_scratch *)alloc;
    if (ret != NULL) {
        memset(ret, 0, sizeof(*ret));
        memcpy(ret->magic, "scratch", 8);
        ret->data = (void *) ((char *) alloc + base_alloc);
        ret->max_size = size;
    }
    return ret;
}